

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pf2iw_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  int32_t iVar1;
  uint32_t uVar2;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  iVar1 = float32_to_int32_round_to_zero_x86_64(s->_s_MMXReg[0],&env->mmx_status);
  uVar2 = satsw(iVar1);
  d->_l_MMXReg[0] = uVar2;
  iVar1 = float32_to_int32_round_to_zero_x86_64(s->_s_MMXReg[1],&env->mmx_status);
  uVar2 = satsw(iVar1);
  d->_l_MMXReg[1] = uVar2;
  return;
}

Assistant:

void helper_pf2iw(CPUX86State *env, MMXReg *d, MMXReg *s)
{
    d->MMX_L(0) = satsw(float32_to_int32_round_to_zero(s->MMX_S(0),
                                                       &env->mmx_status));
    d->MMX_L(1) = satsw(float32_to_int32_round_to_zero(s->MMX_S(1),
                                                       &env->mmx_status));
}